

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O2

string * duckdb::KeywordHelper::WriteOptionallyQuoted
                   (string *__return_storage_ptr__,string *text,char quote,bool allow_caps)

{
  bool bVar1;
  
  bVar1 = RequiresQuotes(text,allow_caps);
  if (bVar1) {
    WriteQuoted(__return_storage_ptr__,text,quote);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  }
  return __return_storage_ptr__;
}

Assistant:

string KeywordHelper::WriteOptionallyQuoted(const string &text, char quote, bool allow_caps) {
	if (!RequiresQuotes(text, allow_caps)) {
		return text;
	}
	return WriteQuoted(text, quote);
}